

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.h
# Opt level: O0

void __thiscall GameLogic::GameLogic(GameLogic *this)

{
  GameLogic *this_local;
  
  IDManager::IDManager(&this->idManager);
  MapInfo::MapInfo(&this->mapInfo);
  std::vector<int,_std::allocator<int>_>::vector(&this->playerID);
  std::map<int,_Unit_*,_std::less<int>,_std::allocator<std::pair<const_int,_Unit_*>_>_>::map
            (&this->unitInfo);
  std::
  map<int,_PlayerIDManager,_std::less<int>,_std::allocator<std::pair<const_int,_PlayerIDManager>_>_>
  ::map(&this->playerIDMgr);
  std::vector<std::pair<int,_Action>,_std::allocator<std::pair<int,_Action>_>_>::vector
            (&this->actions);
  std::vector<Command,_std::allocator<Command>_>::vector(&this->commands);
  std::__cxx11::string::string((string *)&this->jsoncmd);
  this->logicStat = NotInitialized;
  return;
}

Assistant:

GameLogic() { logicStat = NotInitialized; }